

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O1

void ffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [64];
  float fVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  long StageCnt;
  byte bVar12;
  byte bVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  ulong uVar17;
  long lVar18;
  long lVar19;
  float *pfVar20;
  float *pfVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  float *pfVar27;
  float *pfVar28;
  long lVar29;
  ulong uVar30;
  unsigned_long posA;
  ulong uVar31;
  float *pfVar32;
  float *pfVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  ushort uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  unsigned_long Nrems2;
  unsigned_long Nroot_1_ColInc;
  unsigned_long posAi;
  unsigned_long ColstartShift;
  float *local_158;
  float *local_140;
  float *local_138;
  float *local_130;
  float *local_128;
  float *local_120;
  float *local_110;
  float *local_108;
  float *local_100;
  float *local_f8;
  
  auVar77 = _DAT_00107ac0;
  switch(M) {
  case 0:
    break;
  case 1:
    if (0 < Rows) {
      lVar34 = Rows + 1;
      do {
        auVar61 = *(undefined1 (*) [16])ioptr;
        auVar41 = vshufpd_avx(auVar61,auVar61,1);
        auVar62 = vsubps_avx(auVar41,auVar61);
        *(ulong *)*(undefined1 (*) [16])ioptr =
             CONCAT44(auVar41._4_4_ + auVar61._4_4_,auVar41._0_4_ + auVar61._0_4_);
        *(long *)(*(undefined1 (*) [16])ioptr + 8) = auVar62._8_8_;
        ioptr = (float *)(*(undefined1 (*) [16])ioptr + (2L << (M & 0x3fU)) * 4);
        lVar34 = lVar34 + -1;
      } while (1 < lVar34);
    }
    break;
  case 2:
    if (0 < Rows) {
      lVar34 = Rows + 1;
      do {
        auVar43 = *(undefined1 (*) [32])ioptr;
        auVar42 = vpermpd_avx2(auVar43,0x4e);
        auVar74._0_4_ = auVar43._0_4_ + auVar42._0_4_;
        auVar74._4_4_ = auVar43._4_4_ + auVar42._4_4_;
        auVar74._8_4_ = auVar43._8_4_ + auVar42._8_4_;
        auVar74._12_4_ = auVar43._12_4_ + auVar42._12_4_;
        auVar74._16_4_ = auVar43._16_4_ + auVar42._16_4_;
        auVar74._20_4_ = auVar43._20_4_ + auVar42._20_4_;
        auVar74._24_4_ = auVar43._24_4_ + auVar42._24_4_;
        auVar74._28_4_ = auVar43._28_4_ + auVar42._28_4_;
        auVar43 = vsubps_avx(auVar43,auVar42);
        auVar42 = vpermt2ps_avx512vl(auVar74,auVar77,auVar43);
        auVar43 = vpermpd_avx2(auVar42,0x4e);
        auVar69._0_4_ = auVar42._0_4_ + auVar43._0_4_;
        auVar69._4_4_ = auVar42._4_4_ + auVar43._4_4_;
        auVar69._8_4_ = auVar42._8_4_ + auVar43._8_4_;
        auVar69._12_4_ = auVar42._12_4_ + auVar43._12_4_;
        auVar69._16_4_ = auVar42._16_4_ + auVar43._16_4_;
        auVar69._20_4_ = auVar42._20_4_ + auVar43._20_4_;
        auVar69._24_4_ = auVar42._24_4_ + auVar43._24_4_;
        auVar69._28_4_ = auVar42._28_4_ + auVar43._28_4_;
        auVar43 = vsubps_avx(auVar42,auVar43);
        auVar43 = vblendps_avx(auVar69,auVar43,0x78);
        *(undefined1 (*) [32])ioptr = auVar43;
        ioptr = (float *)(*(undefined1 (*) [32])ioptr + (2L << (M & 0x3fU)) * 4);
        lVar34 = lVar34 + -1;
      } while (1 < lVar34);
    }
    break;
  case 3:
    if (0 < Rows) {
      pfVar21 = ioptr + 0xe;
      lVar34 = Rows + 1;
      auVar61 = ZEXT816(0x3f3504f3bf3504f3);
      auVar66._8_4_ = 0x40000000;
      auVar66._0_8_ = 0x4000000040000000;
      auVar66._12_4_ = 0x40000000;
      do {
        uVar17 = *(ulong *)(pfVar21 + -6);
        auVar70._8_8_ = 0;
        auVar70._0_8_ = uVar17;
        uVar31 = *(ulong *)(pfVar21 + -2);
        auVar75._8_8_ = 0;
        auVar75._0_8_ = uVar31;
        uVar35 = *(ulong *)(pfVar21 + -4);
        auVar78._8_8_ = 0;
        auVar78._0_8_ = uVar35;
        uVar24 = *(ulong *)(pfVar21 + -0xe);
        auVar82._8_8_ = 0;
        auVar82._0_8_ = uVar24;
        uVar30 = *(ulong *)(pfVar21 + -0xc);
        auVar86._8_8_ = 0;
        auVar86._0_8_ = uVar30;
        uVar3 = *(ulong *)(pfVar21 + -10);
        auVar88._8_8_ = 0;
        auVar88._0_8_ = uVar3;
        uVar4 = *(ulong *)(pfVar21 + -8);
        auVar89._8_8_ = 0;
        auVar89._0_8_ = uVar4;
        uVar5 = *(ulong *)pfVar21;
        auVar91._8_8_ = 0;
        auVar91._0_8_ = uVar5;
        auVar92._0_4_ = (float)uVar17 + (float)uVar24;
        auVar92._4_4_ = (float)(uVar17 >> 0x20) + (float)(uVar24 >> 0x20);
        auVar92._8_8_ = 0;
        auVar93._0_4_ = (float)uVar3 + (float)uVar31;
        auVar93._4_4_ = (float)(uVar3 >> 0x20) + (float)(uVar31 >> 0x20);
        auVar93._8_8_ = 0;
        auVar94._0_4_ = auVar93._0_4_ + auVar92._0_4_;
        auVar94._4_4_ = auVar93._4_4_ + auVar92._4_4_;
        auVar94._8_8_ = 0;
        auVar95._0_4_ = (float)uVar35 + (float)uVar30;
        auVar95._4_4_ = (float)(uVar35 >> 0x20) + (float)(uVar30 >> 0x20);
        auVar95._8_8_ = 0;
        auVar96._0_4_ = (float)uVar5 + (float)uVar4;
        auVar96._4_4_ = (float)(uVar5 >> 0x20) + (float)(uVar4 >> 0x20);
        auVar96._8_8_ = 0;
        auVar38 = vaddps_avx512vl(auVar96,auVar95);
        auVar39 = vaddps_avx512vl(auVar38,auVar94);
        auVar41 = vsubps_avx(auVar86,auVar78);
        auVar41 = vshufps_avx(auVar41,auVar41,0xe1);
        auVar64 = vsubps_avx(auVar89,auVar91);
        auVar40 = vsubps_avx(auVar41,auVar64);
        auVar62 = vmovshdup_avx(auVar40);
        auVar79._0_4_ = auVar64._0_4_ + auVar41._0_4_;
        auVar79._4_4_ = auVar64._4_4_ + auVar41._4_4_;
        auVar79._8_4_ = auVar64._8_4_ + auVar41._8_4_;
        auVar79._12_4_ = auVar64._12_4_ + auVar41._12_4_;
        auVar41 = vblendps_avx(auVar40,auVar79,2);
        auVar87._0_4_ = auVar41._0_4_ * auVar61._0_4_;
        auVar87._4_4_ = auVar41._4_4_ * auVar61._4_4_;
        auVar87._8_4_ = auVar41._8_4_ * 0.0;
        auVar87._12_4_ = auVar41._12_4_ * 0.0;
        fVar10 = auVar62._0_4_ * 0.70710677;
        auVar62 = vsubps_avx(auVar82,auVar70);
        auVar41 = vsubps_avx(auVar88,auVar75);
        auVar41 = vshufps_avx(auVar41,auVar41,0xe1);
        auVar83._0_4_ = auVar62._0_4_ + auVar41._0_4_;
        auVar83._4_4_ = auVar62._4_4_ + auVar41._4_4_;
        auVar83._8_4_ = auVar62._8_4_ + auVar41._8_4_;
        auVar83._12_4_ = auVar62._12_4_ + auVar41._12_4_;
        auVar64 = vsubps_avx(auVar62,auVar41);
        auVar41 = vblendps_avx(auVar83,auVar64,2);
        auVar62 = vmovshdup_avx(auVar87);
        fVar11 = (auVar87._0_4_ + auVar83._0_4_) - auVar62._0_4_;
        auVar40 = vmovshdup_avx512vl(auVar64);
        auVar40 = vaddss_avx512f(auVar87,auVar40);
        fVar8 = auVar62._0_4_ + auVar40._0_4_;
        auVar62 = vinsertps_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar8),0x10);
        auVar41 = vfmsub231ps_fma(auVar62,auVar66,auVar41);
        auVar77._16_16_ = auVar41;
        auVar77._0_16_ = auVar61;
        auVar41 = vblendps_avx(auVar64,auVar83,2);
        auVar62 = vmovshdup_avx(auVar83);
        auVar62 = vinsertps_avx(ZEXT416((uint)(auVar64._0_4_ - auVar79._0_4_ * 0.70710677)),
                                ZEXT416((uint)(auVar79._0_4_ * 0.70710677 + auVar62._0_4_)),0x10);
        auVar71._0_4_ = auVar62._0_4_ + fVar10;
        auVar71._4_4_ = auVar62._4_4_ + fVar10;
        auVar71._8_4_ = auVar62._8_4_ + fVar10;
        auVar71._12_4_ = auVar62._12_4_ + fVar10;
        auVar41 = vfmsub213ps_fma(auVar41,auVar66,auVar71);
        auVar43._16_16_ = auVar41;
        auVar43._0_16_ = auVar61;
        auVar77 = vperm2f128_avx(auVar77,auVar43,0x31);
        auVar62 = vsubps_avx(auVar92,auVar93);
        auVar41 = vsubps_avx(auVar95,auVar96);
        auVar41 = vshufps_avx(auVar41,auVar41,0xe1);
        auVar90._0_4_ = auVar62._0_4_ + auVar41._0_4_;
        auVar90._4_4_ = auVar62._4_4_ + auVar41._4_4_;
        auVar90._8_4_ = auVar62._8_4_ + auVar41._8_4_;
        auVar90._12_4_ = auVar62._12_4_ + auVar41._12_4_;
        auVar62 = vsubps_avx(auVar62,auVar41);
        auVar41 = vblendps_avx(auVar90,auVar62,2);
        auVar43 = vinsertf32x4_avx512vl(ZEXT1632(auVar39),auVar41,1);
        auVar77 = vunpcklpd_avx(auVar43,auVar77);
        *(undefined1 (*) [32])(pfVar21 + -0xe) = auVar77;
        auVar41 = vsubps_avx512vl(auVar94,auVar38);
        uVar17 = vmovlps_avx(auVar41);
        *(ulong *)(pfVar21 + -6) = uVar17;
        pfVar21[-4] = fVar11;
        pfVar21[-3] = fVar8;
        auVar41 = vblendps_avx(auVar62,auVar90,2);
        auVar41 = vmovlhps_avx(auVar41,auVar71);
        *(undefined1 (*) [16])(pfVar21 + -2) = auVar41;
        pfVar21 = pfVar21 + (2L << (M & 0x3fU));
        lVar34 = lVar34 + -1;
      } while (1 < lVar34);
    }
    break;
  default:
    if (0 < Rows) {
      uVar17 = (ulong)((uint)((int)(M + 3) - (int)(M + 3 >> 0x3f)) >> 1);
      lVar29 = 1L << (uVar17 & 0x3f);
      uVar31 = 1L << (M & 0x3fU);
      lVar26 = uVar31 - lVar29;
      uVar25 = (uint)((int)M - (int)(M >> 0x3f)) >> 1;
      lVar18 = 1L << ((ulong)(byte)((char)uVar25 + 1) & 0x3f);
      StageCnt = (M + -1) / 3;
      lVar34 = M + -1 + StageCnt * -3;
      auVar44 = vpbroadcastq_avx512f();
      uVar35 = ~(-1L << ((ulong)(uVar25 - 1) & 0x3f));
      lVar22 = 2L << (M & 0x3fU);
      local_130 = ioptr + ((uVar31 * 2 + 1) - lVar29);
      local_120 = ioptr + lVar29 * -2 + uVar31;
      local_138 = ioptr + (uVar31 - lVar29);
      local_140 = ioptr + ((uVar31 + 1) - lVar29);
      local_128 = ioptr + lVar29 * -2 + uVar31 * 2;
      auVar45 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar46 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar7 = vmovdqu64_avx512f(auVar44);
      do {
        auVar16 = _DAT_001073c0;
        auVar15 = _DAT_00107380;
        auVar14 = _DAT_00107340;
        if (0 < 4L << (uVar17 & 0x3f)) {
          local_158 = local_140;
          local_f8 = local_128;
          local_100 = local_120;
          local_108 = local_130;
          local_110 = local_138;
          uVar24 = uVar35;
          pfVar21 = ioptr;
          do {
            do {
              lVar19 = (long)BRLow[uVar24];
              pfVar28 = pfVar21 + lVar26 + lVar19 * 4;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = *(ulong *)(pfVar21 + lVar26 + lVar19 * 4);
              auVar63 = ZEXT1664(auVar61);
              auVar41._8_8_ = 0;
              auVar41._0_8_ = *(ulong *)(pfVar28 + uVar31);
              auVar65 = ZEXT1664(auVar41);
              if ((long)uVar24 < (long)uVar35) {
                lVar23 = uVar24 << (((M + 1) - (M + 1 >> 0x3f) >> 1) + 1U & 0x3f);
                pfVar20 = local_158;
                pfVar27 = local_f8;
                uVar30 = uVar35;
                pfVar32 = local_100;
                pfVar33 = local_108;
                pfVar28 = local_110;
                do {
                  lVar36 = (long)BRLow[uVar30];
                  auVar38._0_4_ = auVar63._0_4_ + auVar65._0_4_;
                  auVar38._4_4_ = auVar63._4_4_ + auVar65._4_4_;
                  auVar38._8_4_ = auVar63._8_4_ + auVar65._8_4_;
                  auVar38._12_4_ = auVar63._12_4_ + auVar65._12_4_;
                  auVar61 = vsubps_avx(auVar63._0_16_,auVar65._0_16_);
                  auVar61 = vmovlhps_avx(auVar38,auVar61);
                  uVar1 = *(undefined8 *)(pfVar28 + lVar19 * 4 + 2);
                  auVar64._8_8_ = uVar1;
                  auVar64._0_8_ = uVar1;
                  uVar2 = *(undefined8 *)(pfVar33 + lVar19 * 4 + 1);
                  auVar39._8_8_ = uVar2;
                  auVar39._0_8_ = uVar2;
                  auVar41 = vsubps_avx(auVar64,auVar39);
                  uVar30 = uVar30 - 1;
                  uVar3 = *(ulong *)(pfVar21 + lVar23 + lVar36 * 4);
                  auVar67._8_8_ = 0;
                  auVar67._0_8_ = uVar3;
                  uVar4 = *(ulong *)(pfVar21 + lVar23 + lVar36 * 4 + 2);
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ = uVar4;
                  uVar5 = *(ulong *)(pfVar21 + lVar23 + lVar36 * 4 + uVar31);
                  auVar76._8_8_ = 0;
                  auVar76._0_8_ = uVar5;
                  uVar6 = *(ulong *)(pfVar21 + lVar23 + lVar36 * 4 + uVar31 + 2);
                  auVar80._8_8_ = 0;
                  auVar80._0_8_ = uVar6;
                  auVar84._0_4_ = (float)uVar6 + (float)uVar4;
                  auVar84._4_4_ = (float)(uVar6 >> 0x20) + (float)(uVar4 >> 0x20);
                  auVar84._8_8_ = 0;
                  auVar62 = vsubps_avx(auVar72,auVar80);
                  auVar81._0_4_ = (float)uVar5 + (float)uVar3;
                  auVar81._4_4_ = (float)(uVar5 >> 0x20) + (float)(uVar3 >> 0x20);
                  auVar81._8_8_ = 0;
                  auVar64 = vsubps_avx(auVar67,auVar76);
                  *(undefined1 (*) [16])(pfVar21 + lVar23 + lVar36 * 4) = auVar61;
                  *(ulong *)(pfVar21 + lVar23 + lVar36 * 4 + uVar31) =
                       CONCAT44((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20),
                                (float)uVar2 + (float)uVar1);
                  *(long *)(pfVar21 + lVar23 + lVar36 * 4 + uVar31 + 2) = auVar41._8_8_;
                  pfVar28[lVar19 * 4] = auVar81._0_4_;
                  fVar8 = (float)vextractps_avx(auVar81,1);
                  pfVar28[lVar19 * 4 + 1] = fVar8;
                  uVar1 = vmovlps_avx(auVar64);
                  *(undefined8 *)(pfVar28 + lVar19 * 4 + 2) = uVar1;
                  pfVar33[lVar19 * 4 + -1] = auVar84._0_4_;
                  fVar8 = (float)vextractps_avx(auVar84,1);
                  pfVar33[lVar19 * 4] = fVar8;
                  uVar1 = vmovlps_avx(auVar62);
                  *(undefined8 *)(pfVar33 + lVar19 * 4 + 1) = uVar1;
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = *(ulong *)(pfVar32 + lVar19 * 4);
                  auVar63 = ZEXT1664(auVar62);
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = *(ulong *)(pfVar27 + lVar19 * 4);
                  auVar65 = ZEXT1664(auVar40);
                  pfVar28 = pfVar28 + -lVar29;
                  pfVar33 = pfVar33 + -lVar29;
                  pfVar32 = pfVar32 + -lVar29;
                  pfVar27 = pfVar27 + -lVar29;
                  pfVar20 = pfVar20 + -lVar29;
                } while ((long)uVar24 < (long)uVar30);
                auVar61 = vmovshdup_avx(auVar40);
                fVar8 = auVar61._0_4_;
                auVar61 = vmovshdup_avx(auVar62);
                fVar10 = auVar61._0_4_;
                pfVar28 = pfVar28 + lVar19 * 4;
                pfVar27 = pfVar33 + lVar19 * 4;
                pfVar33 = pfVar33 + lVar19 * 4 + -1;
                pfVar20 = pfVar20 + lVar19 * 4;
              }
              else {
                pfVar20 = pfVar21 + lVar26 + lVar19 * 4 + 1;
                pfVar33 = pfVar28 + uVar31;
                pfVar27 = pfVar28 + uVar31 + 1;
                auVar61 = vmovshdup_avx(auVar61);
                fVar10 = auVar61._0_4_;
                auVar61 = vmovshdup_avx(auVar41);
                fVar8 = auVar61._0_4_;
              }
              uVar30 = *(ulong *)(pfVar28 + 2);
              auVar68._8_8_ = 0;
              auVar68._0_8_ = uVar30;
              uVar3 = *(ulong *)(pfVar28 + uVar31 + 2);
              auVar73._8_8_ = 0;
              auVar73._0_8_ = uVar3;
              auVar85._0_4_ = (float)uVar3 + (float)uVar30;
              auVar85._4_4_ = (float)(uVar3 >> 0x20) + (float)(uVar30 >> 0x20);
              auVar85._8_8_ = 0;
              auVar61 = vsubps_avx(auVar68,auVar73);
              *pfVar28 = auVar65._0_4_ + auVar63._0_4_;
              *pfVar20 = fVar8 + fVar10;
              pfVar28[2] = auVar63._0_4_ - auVar65._0_4_;
              pfVar28[3] = fVar10 - fVar8;
              *pfVar33 = auVar85._0_4_;
              fVar8 = (float)vextractps_avx(auVar85,1);
              *pfVar27 = fVar8;
              uVar1 = vmovlps_avx(auVar61);
              *(undefined8 *)(pfVar28 + uVar31 + 2) = uVar1;
              bVar9 = 0 < (long)uVar24;
              uVar24 = uVar24 - 1;
            } while (bVar9);
            pfVar21 = pfVar21 + lVar18;
            local_110 = local_110 + lVar18;
            local_108 = local_108 + lVar18;
            local_100 = local_100 + lVar18;
            local_f8 = local_f8 + lVar18;
            local_158 = local_158 + lVar18;
            uVar24 = uVar35;
          } while (pfVar21 < ioptr + lVar29);
        }
        uVar24 = (ulong)(lVar34 == 1) * 2 + 2;
        if (2 < (ulong)M && lVar34 == 1) {
          uVar24 = 0;
          pfVar21 = ioptr;
          do {
            auVar63 = vpbroadcastq_avx512f();
            auVar65 = vporq_avx512f(auVar63,auVar45);
            auVar63 = vporq_avx512f(auVar63,auVar46);
            uVar1 = vpcmpuq_avx512f(auVar63,auVar44,2);
            bVar12 = (byte)uVar1;
            uVar1 = vpcmpuq_avx512f(auVar65,auVar44,2);
            bVar13 = (byte)uVar1;
            uVar37 = CONCAT11(bVar13,bVar12);
            uVar30 = (ulong)uVar37;
            auVar63 = vgatherdps_avx512f(pfVar21[-lVar29]);
            auVar65._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar63._4_4_;
            auVar65._0_4_ = (uint)(bVar12 & 1) * auVar63._0_4_;
            auVar65._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar63._8_4_;
            auVar65._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar63._12_4_;
            auVar65._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar63._16_4_;
            auVar65._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar63._20_4_;
            auVar65._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar63._24_4_;
            auVar65._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar63._28_4_;
            auVar65._32_4_ = (uint)(bVar13 & 1) * auVar63._32_4_;
            auVar65._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar63._36_4_;
            auVar65._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar63._40_4_;
            auVar65._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar63._44_4_;
            auVar65._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar63._48_4_;
            auVar65._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar63._52_4_;
            auVar65._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar63._56_4_;
            auVar65._60_4_ = (uint)(bVar13 >> 7) * auVar63._60_4_;
            auVar47 = vgatherdps_avx512f(pfVar21[4 - lVar29]);
            auVar63._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar47._4_4_;
            auVar63._0_4_ = (uint)(bVar12 & 1) * auVar47._0_4_;
            auVar63._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar47._8_4_;
            auVar63._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar47._12_4_;
            auVar63._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar47._16_4_;
            auVar63._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar47._20_4_;
            auVar63._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar47._24_4_;
            auVar63._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar47._28_4_;
            auVar63._32_4_ = (uint)(bVar13 & 1) * auVar47._32_4_;
            auVar63._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar47._36_4_;
            auVar63._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar47._40_4_;
            auVar63._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar47._44_4_;
            auVar63._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar47._48_4_;
            auVar63._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar47._52_4_;
            auVar63._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar47._56_4_;
            auVar63._60_4_ = (uint)(bVar13 >> 7) * auVar47._60_4_;
            auVar47 = vgatherdps_avx512f(pfVar21[1 - lVar29]);
            auVar52._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar47._4_4_;
            auVar52._0_4_ = (uint)(bVar12 & 1) * auVar47._0_4_;
            auVar52._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar47._8_4_;
            auVar52._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar47._12_4_;
            auVar52._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar47._16_4_;
            auVar52._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar47._20_4_;
            auVar52._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar47._24_4_;
            auVar52._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar47._28_4_;
            auVar52._32_4_ = (uint)(bVar13 & 1) * auVar47._32_4_;
            auVar52._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar47._36_4_;
            auVar52._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar47._40_4_;
            auVar52._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar47._44_4_;
            auVar52._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar47._48_4_;
            auVar52._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar47._52_4_;
            auVar52._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar47._56_4_;
            auVar52._60_4_ = (uint)(bVar13 >> 7) * auVar47._60_4_;
            auVar48 = vgatherdps_avx512f(pfVar21[5 - lVar29]);
            auVar47._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar48._4_4_;
            auVar47._0_4_ = (uint)(bVar12 & 1) * auVar48._0_4_;
            auVar47._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar48._8_4_;
            auVar47._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar48._12_4_;
            auVar47._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar48._16_4_;
            auVar47._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar48._20_4_;
            auVar47._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar48._24_4_;
            auVar47._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar48._28_4_;
            auVar47._32_4_ = (uint)(bVar13 & 1) * auVar48._32_4_;
            auVar47._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar48._36_4_;
            auVar47._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar48._40_4_;
            auVar47._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar48._44_4_;
            auVar47._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar48._48_4_;
            auVar47._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar48._52_4_;
            auVar47._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar48._56_4_;
            auVar47._60_4_ = (uint)(bVar13 >> 7) * auVar48._60_4_;
            auVar48 = vgatherdps_avx512f(pfVar21[8 - lVar29]);
            auVar53._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar48._4_4_;
            auVar53._0_4_ = (uint)(bVar12 & 1) * auVar48._0_4_;
            auVar53._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar48._8_4_;
            auVar53._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar48._12_4_;
            auVar53._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar48._16_4_;
            auVar53._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar48._20_4_;
            auVar53._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar48._24_4_;
            auVar53._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar48._28_4_;
            auVar53._32_4_ = (uint)(bVar13 & 1) * auVar48._32_4_;
            auVar53._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar48._36_4_;
            auVar53._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar48._40_4_;
            auVar53._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar48._44_4_;
            auVar53._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar48._48_4_;
            auVar53._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar48._52_4_;
            auVar53._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar48._56_4_;
            auVar53._60_4_ = (uint)(bVar13 >> 7) * auVar48._60_4_;
            auVar49 = vgatherdps_avx512f(pfVar21[0xc - lVar29]);
            auVar48._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar49._4_4_;
            auVar48._0_4_ = (uint)(bVar12 & 1) * auVar49._0_4_;
            auVar48._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar49._8_4_;
            auVar48._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar49._12_4_;
            auVar48._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar49._16_4_;
            auVar48._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar49._20_4_;
            auVar48._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar49._24_4_;
            auVar48._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar49._28_4_;
            auVar48._32_4_ = (uint)(bVar13 & 1) * auVar49._32_4_;
            auVar48._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar49._36_4_;
            auVar48._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar49._40_4_;
            auVar48._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar49._44_4_;
            auVar48._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar49._48_4_;
            auVar48._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar49._52_4_;
            auVar48._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar49._56_4_;
            auVar48._60_4_ = (uint)(bVar13 >> 7) * auVar49._60_4_;
            auVar49 = vgatherdps_avx512f(pfVar21[9 - lVar29]);
            auVar60._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar49._4_4_;
            auVar60._0_4_ = (uint)(bVar12 & 1) * auVar49._0_4_;
            auVar60._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar49._8_4_;
            auVar60._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar49._12_4_;
            auVar60._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar49._16_4_;
            auVar60._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar49._20_4_;
            auVar60._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar49._24_4_;
            auVar60._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar49._28_4_;
            auVar60._32_4_ = (uint)(bVar13 & 1) * auVar49._32_4_;
            auVar60._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar49._36_4_;
            auVar60._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar49._40_4_;
            auVar60._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar49._44_4_;
            auVar60._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar49._48_4_;
            auVar60._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar49._52_4_;
            auVar60._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar49._56_4_;
            auVar60._60_4_ = (uint)(bVar13 >> 7) * auVar49._60_4_;
            auVar50 = vgatherdps_avx512f(pfVar21[0xd - lVar29]);
            auVar49._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar50._4_4_;
            auVar49._0_4_ = (uint)(bVar12 & 1) * auVar50._0_4_;
            auVar49._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar50._8_4_;
            auVar49._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar50._12_4_;
            auVar49._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar50._16_4_;
            auVar49._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar50._20_4_;
            auVar49._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar50._24_4_;
            auVar49._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar50._28_4_;
            auVar49._32_4_ = (uint)(bVar13 & 1) * auVar50._32_4_;
            auVar49._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar50._36_4_;
            auVar49._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar50._40_4_;
            auVar49._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar50._44_4_;
            auVar49._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar50._48_4_;
            auVar49._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar50._52_4_;
            auVar49._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar50._56_4_;
            auVar49._60_4_ = (uint)(bVar13 >> 7) * auVar50._60_4_;
            auVar50 = vaddps_avx512f(auVar63,auVar65);
            auVar51 = vaddps_avx512f(auVar47,auVar52);
            auVar63 = vsubps_avx512f(auVar65,auVar63);
            auVar65 = vsubps_avx512f(auVar52,auVar47);
            auVar47 = vaddps_avx512f(auVar48,auVar53);
            auVar52 = vaddps_avx512f(auVar49,auVar60);
            auVar48 = vsubps_avx512f(auVar53,auVar48);
            auVar53 = vsubps_avx512f(auVar60,auVar49);
            vscatterdps_avx512f(ZEXT864(pfVar21) + auVar14,uVar30,auVar50);
            vscatterdps_avx512f(ZEXT864(pfVar21) + auVar15,uVar30,auVar51);
            vscatterdps_avx512f(ZEXT864(pfVar21) + ZEXT864(0x10) + auVar14,uVar30,auVar63);
            vscatterdps_avx512f(ZEXT864(pfVar21) + ZEXT864(0x10) + auVar15,uVar30,auVar65);
            vscatterdps_avx512f(ZEXT864(pfVar21) + ZEXT864(0x20) + auVar14,uVar30,auVar47);
            vscatterdps_avx512f(ZEXT864(pfVar21) + ZEXT864(0x20) + auVar15,uVar30,auVar52);
            vscatterdps_avx512f(ZEXT864(pfVar21) + ZEXT864(0x30) + auVar14,uVar30,auVar48);
            vscatterdps_avx512f(ZEXT864(pfVar21) + ZEXT864(0x30) + auVar15,uVar30,auVar53);
            auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar21 + uVar35));
            auVar50._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar63._4_4_;
            auVar50._0_4_ = (uint)(bVar12 & 1) * auVar63._0_4_;
            auVar50._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar63._8_4_;
            auVar50._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar63._12_4_;
            auVar50._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar63._16_4_;
            auVar50._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar63._20_4_;
            auVar50._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar63._24_4_;
            auVar50._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar63._28_4_;
            auVar50._32_4_ = (uint)(bVar13 & 1) * auVar63._32_4_;
            auVar50._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar63._36_4_;
            auVar50._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar63._40_4_;
            auVar50._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar63._44_4_;
            auVar50._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar63._48_4_;
            auVar50._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar63._52_4_;
            auVar50._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar63._56_4_;
            auVar50._60_4_ = (uint)(bVar13 >> 7) * auVar63._60_4_;
            auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar21 * 2 + 0x10));
            auVar51._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar63._4_4_;
            auVar51._0_4_ = (uint)(bVar12 & 1) * auVar63._0_4_;
            auVar51._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar63._8_4_;
            auVar51._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar63._12_4_;
            auVar51._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar63._16_4_;
            auVar51._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar63._20_4_;
            auVar51._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar63._24_4_;
            auVar51._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar63._28_4_;
            auVar51._32_4_ = (uint)(bVar13 & 1) * auVar63._32_4_;
            auVar51._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar63._36_4_;
            auVar51._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar63._40_4_;
            auVar51._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar63._44_4_;
            auVar51._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar63._48_4_;
            auVar51._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar63._52_4_;
            auVar51._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar63._56_4_;
            auVar51._60_4_ = (uint)(bVar13 >> 7) * auVar63._60_4_;
            auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar21 * 2));
            auVar54._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar63._4_4_;
            auVar54._0_4_ = (uint)(bVar12 & 1) * auVar63._0_4_;
            auVar54._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar63._8_4_;
            auVar54._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar63._12_4_;
            auVar54._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar63._16_4_;
            auVar54._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar63._20_4_;
            auVar54._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar63._24_4_;
            auVar54._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar63._28_4_;
            auVar54._32_4_ = (uint)(bVar13 & 1) * auVar63._32_4_;
            auVar54._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar63._36_4_;
            auVar54._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar63._40_4_;
            auVar54._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar63._44_4_;
            auVar54._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar63._48_4_;
            auVar54._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar63._52_4_;
            auVar54._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar63._56_4_;
            auVar54._60_4_ = (uint)(bVar13 >> 7) * auVar63._60_4_;
            auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar21 + uVar35 + 0x10));
            auVar55._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar63._4_4_;
            auVar55._0_4_ = (uint)(bVar12 & 1) * auVar63._0_4_;
            auVar55._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar63._8_4_;
            auVar55._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar63._12_4_;
            auVar55._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar63._16_4_;
            auVar55._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar63._20_4_;
            auVar55._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar63._24_4_;
            auVar55._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar63._28_4_;
            auVar55._32_4_ = (uint)(bVar13 & 1) * auVar63._32_4_;
            auVar55._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar63._36_4_;
            auVar55._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar63._40_4_;
            auVar55._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar63._44_4_;
            auVar55._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar63._48_4_;
            auVar55._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar63._52_4_;
            auVar55._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar63._56_4_;
            auVar55._60_4_ = (uint)(bVar13 >> 7) * auVar63._60_4_;
            auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar21 + uVar35 + 0x20));
            auVar56._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar63._4_4_;
            auVar56._0_4_ = (uint)(bVar12 & 1) * auVar63._0_4_;
            auVar56._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar63._8_4_;
            auVar56._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar63._12_4_;
            auVar56._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar63._16_4_;
            auVar56._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar63._20_4_;
            auVar56._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar63._24_4_;
            auVar56._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar63._28_4_;
            auVar56._32_4_ = (uint)(bVar13 & 1) * auVar63._32_4_;
            auVar56._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar63._36_4_;
            auVar56._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar63._40_4_;
            auVar56._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar63._44_4_;
            auVar56._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar63._48_4_;
            auVar56._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar63._52_4_;
            auVar56._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar63._56_4_;
            auVar56._60_4_ = (uint)(bVar13 >> 7) * auVar63._60_4_;
            auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar21 * 2 + 0x30));
            auVar57._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar63._4_4_;
            auVar57._0_4_ = (uint)(bVar12 & 1) * auVar63._0_4_;
            auVar57._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar63._8_4_;
            auVar57._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar63._12_4_;
            auVar57._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar63._16_4_;
            auVar57._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar63._20_4_;
            auVar57._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar63._24_4_;
            auVar57._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar63._28_4_;
            auVar57._32_4_ = (uint)(bVar13 & 1) * auVar63._32_4_;
            auVar57._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar63._36_4_;
            auVar57._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar63._40_4_;
            auVar57._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar63._44_4_;
            auVar57._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar63._48_4_;
            auVar57._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar63._52_4_;
            auVar57._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar63._56_4_;
            auVar57._60_4_ = (uint)(bVar13 >> 7) * auVar63._60_4_;
            auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar21 * 2 + 0x20));
            auVar58._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar63._4_4_;
            auVar58._0_4_ = (uint)(bVar12 & 1) * auVar63._0_4_;
            auVar58._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar63._8_4_;
            auVar58._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar63._12_4_;
            auVar58._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar63._16_4_;
            auVar58._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar63._20_4_;
            auVar58._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar63._24_4_;
            auVar58._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar63._28_4_;
            auVar58._32_4_ = (uint)(bVar13 & 1) * auVar63._32_4_;
            auVar58._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar63._36_4_;
            auVar58._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar63._40_4_;
            auVar58._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar63._44_4_;
            auVar58._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar63._48_4_;
            auVar58._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar63._52_4_;
            auVar58._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar63._56_4_;
            auVar58._60_4_ = (uint)(bVar13 >> 7) * auVar63._60_4_;
            auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar21 + uVar35 + 0x30));
            auVar59._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar63._4_4_;
            auVar59._0_4_ = (uint)(bVar12 & 1) * auVar63._0_4_;
            auVar59._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar63._8_4_;
            auVar59._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar63._12_4_;
            auVar59._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * auVar63._16_4_;
            auVar59._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * auVar63._20_4_;
            auVar59._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * auVar63._24_4_;
            auVar59._28_4_ = (uint)((byte)(uVar37 >> 7) & 1) * auVar63._28_4_;
            auVar59._32_4_ = (uint)(bVar13 & 1) * auVar63._32_4_;
            auVar59._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar63._36_4_;
            auVar59._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar63._40_4_;
            auVar59._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar63._44_4_;
            auVar59._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar63._48_4_;
            auVar59._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar63._52_4_;
            auVar59._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar63._56_4_;
            auVar59._60_4_ = (uint)(bVar13 >> 7) * auVar63._60_4_;
            auVar63 = vaddps_avx512f(auVar51,auVar50);
            auVar65 = vsubps_avx512f(auVar54,auVar55);
            auVar47 = vsubps_avx512f(auVar50,auVar51);
            auVar52 = vaddps_avx512f(auVar55,auVar54);
            auVar48 = vaddps_avx512f(auVar57,auVar56);
            auVar53 = vsubps_avx512f(auVar58,auVar59);
            auVar49 = vsubps_avx512f(auVar56,auVar57);
            auVar60 = vaddps_avx512f(auVar59,auVar58);
            vscatterdps_avx512f(ZEXT864(pfVar21) + auVar16,uVar30,auVar63);
            vscatterdps_avx512f(ZEXT864(pfVar21) + auVar47,uVar30,auVar65);
            vscatterdps_avx512f(ZEXT864(pfVar21) + ZEXT864(0x10) + auVar16,uVar30,auVar47);
            vscatterdps_avx512f(ZEXT864(pfVar21) + ZEXT864(0x10) + auVar47,uVar30,auVar52);
            vscatterdps_avx512f(ZEXT864(pfVar21) + ZEXT864(0x20) + auVar16,uVar30,auVar48);
            vscatterdps_avx512f(ZEXT864(pfVar21) + ZEXT864(0x20) + auVar47,uVar30,auVar53);
            vscatterdps_avx512f(ZEXT864(pfVar21) + ZEXT864(0x30) + auVar16,uVar30,auVar49);
            vscatterdps_avx512f(ZEXT864(pfVar21) + ZEXT864(0x30) + auVar47,uVar30,auVar60);
            uVar24 = uVar24 + 0x10;
            pfVar21 = pfVar21 + 0x100;
          } while (((uVar31 >> 3) + 0xf & 0xfffffffffffffff0) != uVar24);
          uVar24 = 4;
        }
        if (lVar34 == 2) {
          bfR4(ioptr,M,uVar24);
          uVar24 = (ulong)(uint)((int)uVar24 << 2);
        }
        if ((ulong)M < 0xc) {
          bfstages(ioptr,M,Utbl,1,uVar24,StageCnt);
        }
        else {
          fftrecurs(ioptr,M,Utbl,1,uVar24,StageCnt);
        }
        ioptr = ioptr + lVar22;
        local_138 = local_138 + lVar22;
        local_130 = local_130 + lVar22;
        local_120 = local_120 + lVar22;
        local_128 = local_128 + lVar22;
        local_140 = local_140 + lVar22;
        auVar44 = vmovdqu64_avx512f(auVar7);
        auVar45 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar46 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        bVar9 = 1 < Rows;
        Rows = Rows + -1;
      } while (bVar9);
    }
  }
  return;
}

Assistant:

void ffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place complex fft on the rows of the input array	*/
/* INPUTS */
/* *ioptr = input data array	*/
/* M = log2 of fft size	(ex M=10 for 1024 point fft) */
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = output data array	*/

long 	StageCnt;
long 	NDiffU;

switch (M){
case 0:
	break;
case 1:
	for (;Rows>0;Rows--){
		fft2pt(ioptr);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		fft4pt(ioptr);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		fft8pt(ioptr);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	for (;Rows>0;Rows--){

		bitrevR2(ioptr, M, BRLow);						/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			bfR2(ioptr, M, NDiffU);				/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			bfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE)
			bfstages(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/

		else{
			fftrecurs(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		ioptr += 2*POW2(M);
	}
}
}